

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fir_filter.cc
# Opt level: O0

void __thiscall
webrtc::FIRFilterC::FIRFilterC(FIRFilterC *this,float *coefficients,size_t coefficients_length)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  float *pfVar5;
  type pfVar6;
  pointer __s;
  ulong local_38;
  size_t i;
  size_t coefficients_length_local;
  float *coefficients_local;
  FIRFilterC *this_local;
  
  FIRFilter::FIRFilter(&this->super_FIRFilter);
  (this->super_FIRFilter)._vptr_FIRFilter = (_func_int **)&PTR__FIRFilterC_002fb5e8;
  this->coefficients_length_ = coefficients_length;
  this->state_length_ = coefficients_length - 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->coefficients_length_;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pfVar5 = (float *)operator_new__(uVar4);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->coefficients_,pfVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->state_length_;
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pfVar5 = (float *)operator_new__(uVar4);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->state_,pfVar5);
  for (local_38 = 0; local_38 < this->coefficients_length_; local_38 = local_38 + 1) {
    fVar1 = coefficients[~local_38 + this->coefficients_length_];
    pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->coefficients_,local_38);
    *pfVar6 = fVar1;
  }
  __s = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->state_);
  memset(__s,0,this->state_length_ << 2);
  return;
}

Assistant:

FIRFilterC::FIRFilterC(const float* coefficients, size_t coefficients_length)
    : coefficients_length_(coefficients_length),
      state_length_(coefficients_length - 1),
      coefficients_(new float[coefficients_length_]),
      state_(new float[state_length_]) {
  for (size_t i = 0; i < coefficients_length_; ++i) {
    coefficients_[i] = coefficients[coefficients_length_ - i - 1];
  }
  memset(state_.get(), 0, state_length_ * sizeof(state_[0]));
}